

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

insert_return_type * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        *this,node_type *node)

{
  EmbeddedIterator it;
  bool bVar1;
  int *key_00;
  size_t hashval_00;
  size_t __n;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  undefined1 auStack_68 [8];
  insert_return_type res;
  UniqueLock m;
  EmbeddedSet *set;
  Inner *inner;
  size_t hashval;
  int *key;
  node_type *node_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_local;
  
  bVar1 = node_handle_base::operator_cast_to_bool((node_handle_base *)node);
  if (bVar1) {
    key_00 = node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
             ::key(node);
    hashval_00 = hash<int>(this,key_00);
    __n = subidx(hashval_00);
    this_00 = &std::
               array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::Inner,_16UL>
               ::operator[](&this->sets_,__n)->set_;
    LockableBaseImpl<phmap::NullMutex>::DoNothing::
    DoNothing<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>::Inner&>
              ((DoNothing *)
               (res.node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                .slot_space_.data + 7),(Inner *)this_00);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::insert((insert_return_type *)auStack_68,this_00,node,hashval_00);
    it.field_1.slot_ = (slot_type *)res.position.ctrl_;
    it.ctrl_ = (ctrl_t *)auStack_68;
    make_iterator(&__return_storage_ptr__->position,this,(Inner *)this_00,it);
    __return_storage_ptr__->inserted = (bool)(res.position.field_1._0_1_ & 1);
    if ((res.position.field_1._0_1_ & 1) == 0) {
      node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
      ::node_handle(&__return_storage_ptr__->node,
                    (node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
                     *)((long)&res.position.field_1 + 4));
    }
    else {
      node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
      ::node_handle(&__return_storage_ptr__->node);
    }
    InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>_>
    ::~InsertReturnType((InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>_>
                         *)auStack_68);
  }
  else {
    end(&__return_storage_ptr__->position,this);
    __return_storage_ptr__->inserted = false;
    node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
    ::node_handle(&__return_storage_ptr__->node);
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node) {
        if (!node) 
            return {end(), false, node_type()};
        auto& key      = node.key();
        size_t hashval = this->hash(key);
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;

        UniqueLock m(inner);
        auto   res  = set.insert(std::move(node), hashval);
        return { make_iterator(&inner, res.position),
                 res.inserted,
                 res.inserted ? node_type() : std::move(res.node) };
    }